

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::ShowMetricsWindow(bool *p_open)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  float fVar3;
  bool bVar4;
  ImGuiIO *pIVar5;
  char *pcVar6;
  ImGuiPopupRef *pIVar7;
  ImGuiWindow **ppIVar8;
  ImDrawList *pIVar9;
  ImGuiTabBar *in_stack_00000020;
  bool *in_stack_00000050;
  char *in_stack_00000058;
  ImDrawList *overlay_draw_list;
  float font_size;
  char buf [32];
  ImGuiWindow *window_1;
  int n_1;
  char *input_source_names [5];
  int n;
  ImGuiWindow *window;
  int i_1;
  int i;
  ImGuiContext *g;
  ImGuiIO *io;
  char *in_stack_000001b0;
  ImDrawList *in_stack_000001b8;
  ImGuiWindow *in_stack_000001c0;
  ImGuiWindowFlags in_stack_00000584;
  bool *in_stack_00000588;
  char *in_stack_00000590;
  ImVec2 *in_stack_fffffffffffffed8;
  ImPool<ImGuiTabBar> *in_stack_fffffffffffffee0;
  ImVec2 *this;
  ImVec2 *b;
  char *in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  char *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff28;
  float in_stack_ffffffffffffff34;
  ImFont *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  ImFont *local_b8;
  uint in_stack_ffffffffffffff50;
  uint uVar10;
  ImVec2 local_a8;
  ImVec2 local_a0;
  ImDrawList *local_98;
  float local_8c;
  char local_88 [32];
  ImGuiWindow *local_68;
  int i_00;
  int local_2c;
  int local_20;
  int local_1c;
  int rounding_corners_flags;
  
  bVar4 = Begin(in_stack_00000590,in_stack_00000588,in_stack_00000584);
  if (bVar4) {
    pIVar5 = GetIO();
    pcVar6 = GetVersion();
    Text("Dear ImGui %s",pcVar6);
    Text((char *)(double)(1000.0 / pIVar5->Framerate),(double)pIVar5->Framerate,
         "Application average %.3f ms/frame (%.1f FPS)");
    uVar10 = pIVar5->MetricsRenderIndices;
    Text("%d vertices, %d indices (%d triangles)",(ulong)(uint)pIVar5->MetricsRenderVertices,
         (ulong)uVar10,(long)pIVar5->MetricsRenderIndices / 3 & 0xffffffff);
    Text("%d active windows (%d visible)",(ulong)(uint)pIVar5->MetricsActiveWindows,
         (ulong)(uint)pIVar5->MetricsRenderWindows);
    Text("%d allocations",(ulong)(uint)pIVar5->MetricsActiveAllocations);
    Checkbox(in_stack_00000058,in_stack_00000050);
    Checkbox(in_stack_00000058,in_stack_00000050);
    Separator();
    pIVar2 = GImGui;
    ShowMetricsWindow::Funcs::NodeWindows
              ((ImVector<ImGuiWindow_*> *)in_stack_fffffffffffffee0,
               (char *)in_stack_fffffffffffffed8);
    bVar4 = TreeNode("DrawList","Active DrawLists (%d)",
                     (ulong)(uint)(pIVar2->DrawDataBuilder).Layers[0].Size);
    local_b8 = in_stack_ffffffffffffff38;
    if (bVar4) {
      for (local_1c = 0; local_1c < (pIVar2->DrawDataBuilder).Layers[0].Size;
          local_1c = local_1c + 1) {
        ImVector<ImDrawList_*>::operator[]((pIVar2->DrawDataBuilder).Layers,local_1c);
        ShowMetricsWindow::Funcs::NodeDrawList
                  (in_stack_000001c0,in_stack_000001b8,in_stack_000001b0);
      }
      TreePop();
      local_b8 = in_stack_ffffffffffffff38;
    }
    bVar4 = TreeNode("Popups","Popups (%d)",(ulong)(uint)(pIVar2->OpenPopupStack).Size);
    if (bVar4) {
      for (local_20 = 0; local_20 < (pIVar2->OpenPopupStack).Size; local_20 = local_20 + 1) {
        pIVar7 = ImVector<ImGuiPopupRef>::operator[](&pIVar2->OpenPopupStack,local_20);
        pIVar1 = pIVar7->Window;
        pIVar7 = ImVector<ImGuiPopupRef>::operator[](&pIVar2->OpenPopupStack,local_20);
        in_stack_ffffffffffffff50 = pIVar7->PopupId;
        if (pIVar1 == (ImGuiWindow *)0x0) {
          local_b8 = (ImFont *)0x1e2c0f;
        }
        else {
          local_b8 = (ImFont *)pIVar1->Name;
        }
        in_stack_ffffffffffffff47 = false;
        if (pIVar1 != (ImGuiWindow *)0x0) {
          in_stack_ffffffffffffff47 = (pIVar1->Flags & 0x1000000U) != 0;
        }
        in_stack_ffffffffffffff28 = "";
        if ((bool)in_stack_ffffffffffffff47 != false) {
          in_stack_ffffffffffffff28 = " ChildWindow";
        }
        fVar3 = (float)((uint)in_stack_ffffffffffffff34 & 0xffffff);
        if (pIVar1 != (ImGuiWindow *)0x0) {
          fVar3 = (float)CONCAT13((pIVar1->Flags & 0x10000000U) != 0,
                                  SUB43(in_stack_ffffffffffffff34,0));
        }
        in_stack_ffffffffffffff34 = fVar3;
        pcVar6 = "";
        if ((char)((uint)in_stack_ffffffffffffff34 >> 0x18) != '\0') {
          pcVar6 = " ChildMenu";
        }
        BulletText("PopupID: %08x, Window: \'%s\'%s%s",(ulong)in_stack_ffffffffffffff50,local_b8,
                   in_stack_ffffffffffffff28,pcVar6);
      }
      TreePop();
    }
    bVar4 = TreeNode("TabBars","Tab Bars (%d)",(ulong)(uint)(pIVar2->TabBars).Data.Size);
    if (bVar4) {
      for (local_2c = 0; local_2c < (pIVar2->TabBars).Data.Size; local_2c = local_2c + 1) {
        ImPool<ImGuiTabBar>::GetByIndex
                  (in_stack_fffffffffffffee0,(ImPoolIdx)((ulong)in_stack_fffffffffffffed8 >> 0x20));
        ShowMetricsWindow::Funcs::NodeTabBar(in_stack_00000020);
      }
      TreePop();
    }
    bVar4 = TreeNode((char *)in_stack_fffffffffffffed8);
    if (bVar4) {
      memcpy(&stack0xffffffffffffffa8,&PTR_anon_var_dwarf_1dcc0_00234b00,0x28);
      if (pIVar2->HoveredWindow == (ImGuiWindow *)0x0) {
        in_stack_ffffffffffffff20 = "NULL";
      }
      else {
        in_stack_ffffffffffffff20 = pIVar2->HoveredWindow->Name;
      }
      Text("HoveredWindow: \'%s\'",in_stack_ffffffffffffff20);
      if (pIVar2->HoveredRootWindow == (ImGuiWindow *)0x0) {
        in_stack_ffffffffffffff18 = "NULL";
      }
      else {
        in_stack_ffffffffffffff18 = pIVar2->HoveredRootWindow->Name;
      }
      Text("HoveredRootWindow: \'%s\'",in_stack_ffffffffffffff18);
      Text((char *)(double)pIVar2->HoveredIdTimer,
           "HoveredId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d",(ulong)pIVar2->HoveredId,
           (ulong)pIVar2->HoveredIdPreviousFrame,(ulong)(pIVar2->HoveredIdAllowOverlap & 1));
      Text((char *)(double)pIVar2->ActiveIdTimer,
           "ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s",
           (ulong)pIVar2->ActiveId,(ulong)pIVar2->ActiveIdPreviousFrame,
           (ulong)(pIVar2->ActiveIdAllowOverlap & 1),
           *(undefined8 *)(&stack0xffffffffffffffa8 + (ulong)pIVar2->ActiveIdSource * 8));
      if (pIVar2->ActiveIdWindow == (ImGuiWindow *)0x0) {
        in_stack_ffffffffffffff10 = "NULL";
      }
      else {
        in_stack_ffffffffffffff10 = pIVar2->ActiveIdWindow->Name;
      }
      Text("ActiveIdWindow: \'%s\'",in_stack_ffffffffffffff10);
      if (pIVar2->MovingWindow == (ImGuiWindow *)0x0) {
        in_stack_ffffffffffffff08 = "NULL";
      }
      else {
        in_stack_ffffffffffffff08 = pIVar2->MovingWindow->Name;
      }
      Text("MovingWindow: \'%s\'",in_stack_ffffffffffffff08);
      if (pIVar2->NavWindow == (ImGuiWindow *)0x0) {
        in_stack_ffffffffffffff00 = "NULL";
      }
      else {
        in_stack_ffffffffffffff00 = pIVar2->NavWindow->Name;
      }
      Text("NavWindow: \'%s\'",in_stack_ffffffffffffff00);
      Text("NavId: 0x%08X, NavLayer: %d",(ulong)pIVar2->NavId,(ulong)pIVar2->NavLayer);
      Text("NavInputSource: %s",
           *(undefined8 *)(&stack0xffffffffffffffa8 + (ulong)pIVar2->NavInputSource * 8));
      Text("NavActive: %d, NavVisible: %d",(ulong)((pIVar2->IO).NavActive & 1),
           (ulong)((pIVar2->IO).NavVisible & 1));
      Text("NavActivateId: 0x%08X, NavInputId: 0x%08X",(ulong)pIVar2->NavActivateId,
           (ulong)pIVar2->NavInputId);
      Text("NavDisableHighlight: %d, NavDisableMouseHover: %d",
           (ulong)(pIVar2->NavDisableHighlight & 1),(ulong)(pIVar2->NavDisableMouseHover & 1));
      if (pIVar2->NavWindowingTarget == (ImGuiWindow *)0x0) {
        in_stack_fffffffffffffef8 = "NULL";
      }
      else {
        in_stack_fffffffffffffef8 = pIVar2->NavWindowingTarget->Name;
      }
      Text("NavWindowingTarget: \'%s\'",in_stack_fffffffffffffef8);
      Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)",
           (ulong)(pIVar2->DragDropActive & 1),(ulong)(pIVar2->DragDropPayload).SourceId,
           (pIVar2->DragDropPayload).DataType,(ulong)(uint)(pIVar2->DragDropPayload).DataSize);
      TreePop();
    }
    if ((((pIVar2->IO).KeyCtrl & 1U) != 0) &&
       ((ShowMetricsWindow::show_window_begin_order & 1U) != 0)) {
      for (i_00 = 0; i_00 < (pIVar2->Windows).Size; i_00 = i_00 + 1) {
        ppIVar8 = ImVector<ImGuiWindow_*>::operator[](&pIVar2->Windows,i_00);
        local_68 = *ppIVar8;
        if (((local_68->Flags & 0x1000000U) == 0) && ((local_68->WasActive & 1U) != 0)) {
          ImFormatString(local_88,0x20,"%d",(ulong)(uint)(int)local_68->BeginOrderWithinContext);
          local_8c = GetFontSize();
          local_8c = local_8c + local_8c;
          pIVar9 = ::GetOverlayDrawList(local_68);
          b = &local_68->Pos;
          this = &local_a8;
          local_98 = pIVar9;
          ImVec2::ImVec2(this,local_8c,local_8c);
          rounding_corners_flags = (int)((ulong)this >> 0x20);
          local_a0 = operator+(in_stack_fffffffffffffed8,(ImVec2 *)0x13751b);
          ImDrawList::AddRectFilled
                    ((ImDrawList *)in_stack_ffffffffffffff00,(ImVec2 *)in_stack_fffffffffffffef8,b,
                     (ImU32)((ulong)pIVar9 >> 0x20),SUB84(pIVar9,0),rounding_corners_flags);
          in_stack_fffffffffffffed8 = (ImVec2 *)0x0;
          ImDrawList::AddText((ImDrawList *)
                              CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),local_b8
                              ,in_stack_ffffffffffffff34,(ImVec2 *)in_stack_ffffffffffffff28,
                              (ImU32)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                              in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                              (float)((ulong)in_stack_ffffffffffffff08 >> 0x20),
                              (ImVec4 *)CONCAT44(uVar10,in_stack_ffffffffffffff50));
        }
      }
    }
    End();
  }
  else {
    End();
  }
  return;
}

Assistant:

void ImGui::ShowMetricsWindow(bool* p_open)
{
    if (!ImGui::Begin("ImGui Metrics", p_open))
    {
        ImGui::End();
        return;
    }

    static bool show_draw_cmd_clip_rects = true;
    static bool show_window_begin_order = false;
    ImGuiIO& io = ImGui::GetIO();
    ImGui::Text("Dear ImGui %s", ImGui::GetVersion());
    ImGui::Text("Application average %.3f ms/frame (%.1f FPS)", 1000.0f / io.Framerate, io.Framerate);
    ImGui::Text("%d vertices, %d indices (%d triangles)", io.MetricsRenderVertices, io.MetricsRenderIndices, io.MetricsRenderIndices / 3);
    ImGui::Text("%d active windows (%d visible)", io.MetricsActiveWindows, io.MetricsRenderWindows);
    ImGui::Text("%d allocations", io.MetricsActiveAllocations);
    ImGui::Checkbox("Show clipping rectangles when hovering draw commands", &show_draw_cmd_clip_rects);
    ImGui::Checkbox("Ctrl shows window begin order", &show_window_begin_order);
    ImGui::Separator();

    struct Funcs
    {
        static void NodeDrawList(ImGuiWindow* window, ImDrawList* draw_list, const char* label)
        {
            bool node_open = ImGui::TreeNode(draw_list, "%s: '%s' %d vtx, %d indices, %d cmds", label, draw_list->_OwnerName ? draw_list->_OwnerName : "", draw_list->VtxBuffer.Size, draw_list->IdxBuffer.Size, draw_list->CmdBuffer.Size);
            if (draw_list == ImGui::GetWindowDrawList())
            {
                ImGui::SameLine();
                ImGui::TextColored(ImColor(255,100,100), "CURRENTLY APPENDING"); // Can't display stats for active draw list! (we don't have the data double-buffered)
                if (node_open) ImGui::TreePop();
                return;
            }

            ImDrawList* overlay_draw_list = GetOverlayDrawList(window); // Render additional visuals into the top-most draw list
            if (window && IsItemHovered())
                overlay_draw_list->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
            if (!node_open)
                return;

            int elem_offset = 0;
            for (const ImDrawCmd* pcmd = draw_list->CmdBuffer.begin(); pcmd < draw_list->CmdBuffer.end(); elem_offset += pcmd->ElemCount, pcmd++)
            {
                if (pcmd->UserCallback == NULL && pcmd->ElemCount == 0)
                    continue;
                if (pcmd->UserCallback)
                {
                    ImGui::BulletText("Callback %p, user_data %p", pcmd->UserCallback, pcmd->UserCallbackData);
                    continue;
                }
                ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;
                bool pcmd_node_open = ImGui::TreeNode((void*)(pcmd - draw_list->CmdBuffer.begin()), "Draw %4d %s vtx, tex 0x%p, clip_rect (%4.0f,%4.0f)-(%4.0f,%4.0f)", pcmd->ElemCount, draw_list->IdxBuffer.Size > 0 ? "indexed" : "non-indexed", pcmd->TextureId, pcmd->ClipRect.x, pcmd->ClipRect.y, pcmd->ClipRect.z, pcmd->ClipRect.w);
                if (show_draw_cmd_clip_rects && ImGui::IsItemHovered())
                {
                    ImRect clip_rect = pcmd->ClipRect;
                    ImRect vtxs_rect;
                    for (int i = elem_offset; i < elem_offset + (int)pcmd->ElemCount; i++)
                        vtxs_rect.Add(draw_list->VtxBuffer[idx_buffer ? idx_buffer[i] : i].pos);
                    clip_rect.Floor(); overlay_draw_list->AddRect(clip_rect.Min, clip_rect.Max, IM_COL32(255,255,0,255));
                    vtxs_rect.Floor(); overlay_draw_list->AddRect(vtxs_rect.Min, vtxs_rect.Max, IM_COL32(255,0,255,255));
                }
                if (!pcmd_node_open)
                    continue;

                // Display individual triangles/vertices. Hover on to get the corresponding triangle highlighted.
                ImGuiListClipper clipper(pcmd->ElemCount/3); // Manually coarse clip our print out of individual vertices to save CPU, only items that may be visible.
                while (clipper.Step())
                    for (int prim = clipper.DisplayStart, vtx_i = elem_offset + clipper.DisplayStart*3; prim < clipper.DisplayEnd; prim++)
                    {
                        char buf[300];
                        char *buf_p = buf, *buf_end = buf + IM_ARRAYSIZE(buf);
                        ImVec2 triangles_pos[3];
                        for (int n = 0; n < 3; n++, vtx_i++)
                        {
                            ImDrawVert& v = draw_list->VtxBuffer[idx_buffer ? idx_buffer[vtx_i] : vtx_i];
                            triangles_pos[n] = v.pos;
                            buf_p += ImFormatString(buf_p, (int)(buf_end - buf_p), "%s %04d: pos (%8.2f,%8.2f), uv (%.6f,%.6f), col %08X\n", (n == 0) ? "vtx" : "   ", vtx_i, v.pos.x, v.pos.y, v.uv.x, v.uv.y, v.col);
                        }
                        ImGui::Selectable(buf, false);
                        if (ImGui::IsItemHovered())
                        {
                            ImDrawListFlags backup_flags = overlay_draw_list->Flags;
                            overlay_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines at is more readable for very large and thin triangles.
                            overlay_draw_list->AddPolyline(triangles_pos, 3, IM_COL32(255,255,0,255), true, 1.0f);
                            overlay_draw_list->Flags = backup_flags;
                        }
                    }
                ImGui::TreePop();
            }
            ImGui::TreePop();
        }

        static void NodeWindows(ImVector<ImGuiWindow*>& windows, const char* label)
        {
            if (!ImGui::TreeNode(label, "%s (%d)", label, windows.Size))
                return;
            for (int i = 0; i < windows.Size; i++)
                Funcs::NodeWindow(windows[i], "Window");
            ImGui::TreePop();
        }

        static void NodeWindow(ImGuiWindow* window, const char* label)
        {
            if (!ImGui::TreeNode(window, "%s '%s', %d @ 0x%p", label, window->Name, window->Active || window->WasActive, window))
                return;
            ImGuiWindowFlags flags = window->Flags;
            NodeDrawList(window, window->DrawList, "DrawList");
            ImGui::BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), SizeContents (%.1f,%.1f)", window->Pos.x, window->Pos.y, window->Size.x, window->Size.y, window->SizeContents.x, window->SizeContents.y);
            ImGui::BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)", flags,
                (flags & ImGuiWindowFlags_ChildWindow)  ? "Child " : "",      (flags & ImGuiWindowFlags_Tooltip)     ? "Tooltip "   : "",  (flags & ImGuiWindowFlags_Popup) ? "Popup " : "",
                (flags & ImGuiWindowFlags_Modal)        ? "Modal " : "",      (flags & ImGuiWindowFlags_ChildMenu)   ? "ChildMenu " : "",  (flags & ImGuiWindowFlags_NoSavedSettings) ? "NoSavedSettings " : "",
                (flags & ImGuiWindowFlags_NoMouseInputs)? "NoMouseInputs":"", (flags & ImGuiWindowFlags_NoNavInputs) ? "NoNavInputs" : "", (flags & ImGuiWindowFlags_AlwaysAutoResize) ? "AlwaysAutoResize" : "");
            ImGui::BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f)", window->Scroll.x, GetWindowScrollMaxX(window), window->Scroll.y, GetWindowScrollMaxY(window));
            ImGui::BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d", window->Active, window->WasActive, window->WriteAccessed, (window->Active || window->WasActive) ? window->BeginOrderWithinContext : -1);
            ImGui::BulletText("Appearing: %d, Hidden: %d (Reg %d Resize %d), SkipItems: %d", window->Appearing, window->Hidden, window->HiddenFramesRegular, window->HiddenFramesForResize, window->SkipItems);
            ImGui::BulletText("NavLastIds: 0x%08X,0x%08X, NavLayerActiveMask: %X", window->NavLastIds[0], window->NavLastIds[1], window->DC.NavLayerActiveMask);
            ImGui::BulletText("NavLastChildNavWindow: %s", window->NavLastChildNavWindow ? window->NavLastChildNavWindow->Name : "NULL");
            if (!window->NavRectRel[0].IsInverted())
                ImGui::BulletText("NavRectRel[0]: (%.1f,%.1f)(%.1f,%.1f)", window->NavRectRel[0].Min.x, window->NavRectRel[0].Min.y, window->NavRectRel[0].Max.x, window->NavRectRel[0].Max.y);
            else
                ImGui::BulletText("NavRectRel[0]: <None>");
            if (window->RootWindow != window) NodeWindow(window->RootWindow, "RootWindow");
            if (window->ParentWindow != NULL) NodeWindow(window->ParentWindow, "ParentWindow");
            if (window->DC.ChildWindows.Size > 0) NodeWindows(window->DC.ChildWindows, "ChildWindows");
            if (window->ColumnsStorage.Size > 0 && ImGui::TreeNode("Columns", "Columns sets (%d)", window->ColumnsStorage.Size))
            {
                for (int n = 0; n < window->ColumnsStorage.Size; n++)
                {
                    const ImGuiColumnsSet* columns = &window->ColumnsStorage[n];
                    if (ImGui::TreeNode((void*)(uintptr_t)columns->ID, "Columns Id: 0x%08X, Count: %d, Flags: 0x%04X", columns->ID, columns->Count, columns->Flags))
                    {
                        ImGui::BulletText("Width: %.1f (MinX: %.1f, MaxX: %.1f)", columns->MaxX - columns->MinX, columns->MinX, columns->MaxX);
                        for (int column_n = 0; column_n < columns->Columns.Size; column_n++)
                            ImGui::BulletText("Column %02d: OffsetNorm %.3f (= %.1f px)", column_n, columns->Columns[column_n].OffsetNorm, OffsetNormToPixels(columns, columns->Columns[column_n].OffsetNorm));
                        ImGui::TreePop();
                    }
                }
                ImGui::TreePop();
            }
            ImGui::BulletText("Storage: %d bytes", window->StateStorage.Data.Size * (int)sizeof(ImGuiStorage::Pair));
            ImGui::TreePop();
        }

        static void NodeTabBar(ImGuiTabBar* tab_bar)
        {
            // Standalone tab bars (not associated to docking/windows functionality) currently hold no discernable strings.
            char buf[256];
            char* p = buf;
            const char* buf_end = buf + IM_ARRAYSIZE(buf);
            p += ImFormatString(p, buf_end - p, "TabBar (%d tabs)%s",
                tab_bar->Tabs.Size, (tab_bar->PrevFrameVisible < ImGui::GetFrameCount() - 2) ? " *Inactive*" : "");
            if (ImGui::TreeNode(tab_bar, "%s", buf))
            {
                for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
                {
                    const ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
                    ImGui::PushID(tab);
                    if (ImGui::SmallButton("<")) { TabBarQueueChangeTabOrder(tab_bar, tab, -1); } ImGui::SameLine(0, 2);
                    if (ImGui::SmallButton(">")) { TabBarQueueChangeTabOrder(tab_bar, tab, +1); } ImGui::SameLine();
                    ImGui::Text("%02d%c Tab 0x%08X", tab_n, (tab->ID == tab_bar->SelectedTabId) ? '*' : ' ', tab->ID);
                    ImGui::PopID();
                }
                ImGui::TreePop();
            }
        }
    };

    // Access private state, we are going to display the draw lists from last frame
    ImGuiContext& g = *GImGui;
    Funcs::NodeWindows(g.Windows, "Windows");
    if (ImGui::TreeNode("DrawList", "Active DrawLists (%d)", g.DrawDataBuilder.Layers[0].Size))
    {
        for (int i = 0; i < g.DrawDataBuilder.Layers[0].Size; i++)
            Funcs::NodeDrawList(NULL, g.DrawDataBuilder.Layers[0][i], "DrawList");
        ImGui::TreePop();
    }
    if (ImGui::TreeNode("Popups", "Popups (%d)", g.OpenPopupStack.Size))
    {
        for (int i = 0; i < g.OpenPopupStack.Size; i++)
        {
            ImGuiWindow* window = g.OpenPopupStack[i].Window;
            ImGui::BulletText("PopupID: %08x, Window: '%s'%s%s", g.OpenPopupStack[i].PopupId, window ? window->Name : "NULL", window && (window->Flags & ImGuiWindowFlags_ChildWindow) ? " ChildWindow" : "", window && (window->Flags & ImGuiWindowFlags_ChildMenu) ? " ChildMenu" : "");
        }
        ImGui::TreePop();
    }
    if (ImGui::TreeNode("TabBars", "Tab Bars (%d)", g.TabBars.Data.Size))
    {
        for (int n = 0; n < g.TabBars.Data.Size; n++)
            Funcs::NodeTabBar(g.TabBars.GetByIndex(n));
        ImGui::TreePop();
    }
    if (ImGui::TreeNode("Internal state"))
    {
        const char* input_source_names[] = { "None", "Mouse", "Nav", "NavKeyboard", "NavGamepad" }; IM_ASSERT(IM_ARRAYSIZE(input_source_names) == ImGuiInputSource_COUNT);
        ImGui::Text("HoveredWindow: '%s'", g.HoveredWindow ? g.HoveredWindow->Name : "NULL");
        ImGui::Text("HoveredRootWindow: '%s'", g.HoveredRootWindow ? g.HoveredRootWindow->Name : "NULL");
        ImGui::Text("HoveredId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d", g.HoveredId, g.HoveredIdPreviousFrame, g.HoveredIdTimer, g.HoveredIdAllowOverlap); // Data is "in-flight" so depending on when the Metrics window is called we may see current frame information or not
        ImGui::Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s", g.ActiveId, g.ActiveIdPreviousFrame, g.ActiveIdTimer, g.ActiveIdAllowOverlap, input_source_names[g.ActiveIdSource]);
        ImGui::Text("ActiveIdWindow: '%s'", g.ActiveIdWindow ? g.ActiveIdWindow->Name : "NULL");
        ImGui::Text("MovingWindow: '%s'", g.MovingWindow ? g.MovingWindow->Name : "NULL");
        ImGui::Text("NavWindow: '%s'", g.NavWindow ? g.NavWindow->Name : "NULL");
        ImGui::Text("NavId: 0x%08X, NavLayer: %d", g.NavId, g.NavLayer);
        ImGui::Text("NavInputSource: %s", input_source_names[g.NavInputSource]);
        ImGui::Text("NavActive: %d, NavVisible: %d", g.IO.NavActive, g.IO.NavVisible);
        ImGui::Text("NavActivateId: 0x%08X, NavInputId: 0x%08X", g.NavActivateId, g.NavInputId);
        ImGui::Text("NavDisableHighlight: %d, NavDisableMouseHover: %d", g.NavDisableHighlight, g.NavDisableMouseHover);
        ImGui::Text("NavWindowingTarget: '%s'", g.NavWindowingTarget ? g.NavWindowingTarget->Name : "NULL");
        ImGui::Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)", g.DragDropActive, g.DragDropPayload.SourceId, g.DragDropPayload.DataType, g.DragDropPayload.DataSize);
        ImGui::TreePop();
    }


    if (g.IO.KeyCtrl && show_window_begin_order)
    {
        for (int n = 0; n < g.Windows.Size; n++)
        {
            ImGuiWindow* window = g.Windows[n];
            if ((window->Flags & ImGuiWindowFlags_ChildWindow) || !window->WasActive)
                continue;
            char buf[32];
            ImFormatString(buf, IM_ARRAYSIZE(buf), "%d", window->BeginOrderWithinContext);
            float font_size = ImGui::GetFontSize() * 2;
            ImDrawList* overlay_draw_list = GetOverlayDrawList(window);
            overlay_draw_list->AddRectFilled(window->Pos, window->Pos + ImVec2(font_size, font_size), IM_COL32(200, 100, 100, 255));
            overlay_draw_list->AddText(NULL, font_size, window->Pos, IM_COL32(255, 255, 255, 255), buf);
        }
    }
    ImGui::End();
}